

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O3

int xmlExcC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns,xmlC14NCtxPtr ctx)

{
  xmlChar *pxVar1;
  xmlChar xVar2;
  _xmlNode *p_Var3;
  xmlChar *pxVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  xmlChar *pxVar8;
  xmlNodePtr pxVar9;
  ulong uVar10;
  _xmlNode *p_Var11;
  ulong uVar12;
  long lVar13;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    xmlC14NErrParam("searching namespaces stack (exc c14n)");
    return 0;
  }
  if (ns == (xmlNsPtr)0x0) {
    p_Var11 = (_xmlNode *)0x1f258f;
    pxVar8 = "";
  }
  else {
    p_Var11 = (_xmlNode *)ns->prefix;
    if (p_Var11 == (_xmlNode *)0x0) {
      p_Var11 = (_xmlNode *)0x1f258f;
    }
    pxVar8 = ns->href;
    if (pxVar8 == (xmlChar *)0x0) {
      pxVar8 = "";
    }
  }
  uVar6 = 0;
  if (*(xmlChar *)&p_Var11->_private == '\0') {
    uVar6 = (uint)(*pxVar8 == '\0');
  }
  if (cur->nsTab == (xmlNsPtr *)0x0) {
    return uVar6;
  }
  uVar10 = (ulong)(uint)cur->nsCurEnd;
  do {
    if ((int)uVar10 < 1) {
      return uVar6;
    }
    uVar12 = uVar10 & 0xffffffff;
    while( true ) {
      uVar10 = uVar12 - 1;
      pxVar9 = (xmlNodePtr)cur->nsTab[uVar12 - 1];
      if (pxVar9 == (xmlNodePtr)0x0) break;
      p_Var3 = pxVar9->children;
      if (p_Var11 == p_Var3) goto LAB_00138ebf;
      if (p_Var3 == (_xmlNode *)0x0) break;
      lVar13 = 0;
      while (xVar2 = *(xmlChar *)((long)&p_Var11->_private + lVar13),
            xVar2 == *(xmlChar *)((long)&p_Var3->_private + lVar13)) {
        lVar13 = lVar13 + 1;
        if (xVar2 == '\0') goto LAB_00138ebf;
      }
      bVar5 = (long)uVar12 < 2;
      uVar12 = uVar10;
      if (bVar5) {
        return uVar6;
      }
    }
  } while (*(xmlChar *)&p_Var11->_private != '\0');
  if (pxVar9 == (xmlNodePtr)0x0) {
    pxVar9 = (xmlNodePtr)0x0;
  }
  else {
LAB_00138ebf:
    pxVar4 = pxVar9->name;
    if (pxVar8 == pxVar4) goto LAB_00138eef;
    if (pxVar4 != (xmlChar *)0x0) {
      lVar13 = 0;
      do {
        pxVar1 = pxVar8 + lVar13;
        if (*pxVar1 != pxVar4[lVar13]) {
          return 0;
        }
        lVar13 = lVar13 + 1;
      } while (*pxVar1 != '\0');
      goto LAB_00138eef;
    }
  }
  if (*pxVar8 != '\0') {
    return 0;
  }
LAB_00138eef:
  if (ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) {
    return 1;
  }
  iVar7 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,cur->nodeTab[uVar10]);
  return iVar7;
}

Assistant:

static int
xmlExcC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns, xmlC14NCtxPtr ctx) {
    int i;
    const xmlChar *prefix;
    const xmlChar *href;
    int has_empty_ns;

    if(cur == NULL) {
        xmlC14NErrParam("searching namespaces stack (exc c14n)");
        return (0);
    }

    /*
     * if the default namespace xmlns="" is not defined yet then
     * we do not want to print it out
     */
    prefix = ((ns == NULL) || (ns->prefix == NULL)) ? BAD_CAST "" : ns->prefix;
    href = ((ns == NULL) || (ns->href == NULL)) ? BAD_CAST "" : ns->href;
    has_empty_ns = (xmlC14NStrEqual(prefix, NULL) && xmlC14NStrEqual(href, NULL));

    if (cur->nsTab != NULL) {
	int start = 0;
        for (i = cur->nsCurEnd - 1; i >= start; --i) {
            xmlNsPtr ns1 = cur->nsTab[i];

	    if(xmlC14NStrEqual(prefix, (ns1 != NULL) ? ns1->prefix : NULL)) {
		if(xmlC14NStrEqual(href, (ns1 != NULL) ? ns1->href : NULL)) {
		    return(xmlC14NIsVisible(ctx, ns1, cur->nodeTab[i]));
		} else {
		    return(0);
		}
	    }
        }
    }
    return(has_empty_ns);
}